

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void register_opcode(disas_proc proc,uint16_t opcode,uint16_t mask)

{
  uint uVar1;
  int iVar2;
  int to;
  int from;
  int i;
  uint16_t mask_local;
  uint16_t opcode_local;
  disas_proc proc_local;
  
  if ((opcode & (mask ^ 0xffff)) != 0) {
    fprintf(_stderr,"qemu internal error: bogus opcode definition %04x/%04x\n",(ulong)opcode,
            (ulong)mask);
    abort();
  }
  for (to = 0x8000; (to & (uint)mask) != 0; to = to >> 1) {
  }
  if (to == 0) {
    to = 1;
  }
  else {
    to = to << 1;
  }
  uVar1 = (uint)opcode & (to - 1U ^ 0xffffffff);
  iVar2 = uVar1 + to;
  for (to = uVar1; to < iVar2; to = to + 1) {
    if ((to & (uint)mask) == (uint)opcode) {
      opcode_table[to] = proc;
    }
  }
  return;
}

Assistant:

static void
register_opcode (disas_proc proc, uint16_t opcode, uint16_t mask)
{
  int i;
  int from;
  int to;

  /* Sanity check.  All set bits must be included in the mask.  */
  if (opcode & ~mask) {
      fprintf(stderr,
              "qemu internal error: bogus opcode definition %04x/%04x\n",
              opcode, mask);
      abort();
  }
  /*
   * This could probably be cleverer.  For now just optimize the case where
   * the top bits are known.
   */
  /* Find the first zero bit in the mask.  */
  i = 0x8000;
  while ((i & mask) != 0)
      i >>= 1;
  /* Iterate over all combinations of this and lower bits.  */
  if (i == 0)
      i = 1;
  else
      i <<= 1;
  from = opcode & ~(i - 1);
  to = from + i;
  for (i = from; i < to; i++) {
      if ((i & mask) == opcode)
          opcode_table[i] = proc;
  }
}